

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state>,_void>
* pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::consume_hex_state
            (maybe<std::tuple<unsigned_int,_pstore::json::details::string_matcher<pstore::exchange::import_ns::callbacks>::state>,_void>
             *__return_storage_ptr__,uint hex,state state,char32_t code_point)

{
  uint uVar1;
  maybe<unsigned_int,_void> local_10;
  
  uVar1 = code_point + L'\xffffffd0';
  if (9 < uVar1) {
    if ((uint)(code_point + L'\xffffff9f') < 6) {
      uVar1 = code_point + L'\xffffffa9';
    }
    else {
      if (5 < (uint)(code_point + L'\xffffffbf')) {
        local_10.valid_ = false;
        local_10._1_3_ = 0;
        local_10.storage_ = (type)0x0;
        goto LAB_001182ee;
      }
      uVar1 = code_point + L'\xffffffc9';
    }
  }
  local_10.valid_ = true;
  local_10.storage_ = (type)(hex * 0x10 + uVar1);
LAB_001182ee:
  operator>>=(__return_storage_ptr__,&local_10,(anon_class_4_1_a8a4b3b1)state);
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_hex_state (unsigned const hex,
                                                               enum state const state,
                                                               char32_t const code_point)
                -> maybe<std::tuple<unsigned, enum state>> {

                    return hex_value (code_point, hex) >>=
                           [state] (unsigned value) {
                               PSTORE_ASSERT (value <= std::numeric_limits<std::uint16_t>::max ());
                               auto next_state = state;
                               switch (state) {
                               case hex1_state: next_state = hex2_state; break;
                               case hex2_state: next_state = hex3_state; break;
                               case hex3_state: next_state = hex4_state; break;
                               case hex4_state: next_state = normal_char_state; break;

                               case start_state:
                               case normal_char_state:
                               case escape_state:
                               case done_state:
                                   PSTORE_ASSERT (false);
                                   return nothing<std::tuple<unsigned, enum state>> ();
                               }

                               return just (std::make_tuple (value, next_state));
                           };
                }